

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathSubstringAfterFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int iVar1;
  long lVar2;
  xmlChar *pxVar3;
  xmlXPathObjectPtr value;
  xmlXPathObjectPtr pxVar4;
  xmlXPathObjectPtr pxVar5;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 2) {
    if (1 < ctxt->valueNr) {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      iVar1 = ctxt->valueNr;
      lVar2 = (long)iVar1;
      if (lVar2 < 1) {
        pxVar4 = (xmlXPathObjectPtr)0x0;
      }
      else {
        ctxt->valueNr = iVar1 + -1;
        if (iVar1 == 1) {
          pxVar4 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar4 = ctxt->valueTab[lVar2 + -2];
        }
        ctxt->value = pxVar4;
        pxVar4 = ctxt->valueTab[lVar2 + -1];
        ctxt->valueTab[lVar2 + -1] = (xmlXPathObjectPtr)0x0;
      }
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      iVar1 = ctxt->valueNr;
      lVar2 = (long)iVar1;
      if (lVar2 < 1) {
        pxVar5 = (xmlXPathObjectPtr)0x0;
      }
      else {
        ctxt->valueNr = iVar1 + -1;
        if (iVar1 == 1) {
          pxVar5 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar5 = ctxt->valueTab[lVar2 + -2];
        }
        ctxt->value = pxVar5;
        pxVar5 = ctxt->valueTab[lVar2 + -1];
        ctxt->valueTab[lVar2 + -1] = (xmlXPathObjectPtr)0x0;
      }
      if (ctxt->error == 0) {
        pxVar3 = xmlStrstr(pxVar5->stringval,pxVar4->stringval);
        if (pxVar3 == (xmlChar *)0x0) {
          pxVar3 = "";
        }
        else {
          iVar1 = xmlStrlen(pxVar4->stringval);
          pxVar3 = pxVar3 + iVar1;
        }
        pxVar3 = xmlStrdup(pxVar3);
        if (pxVar3 == (xmlChar *)0x0) {
          xmlXPathPErrMemory(ctxt);
        }
        else {
          value = xmlXPathCacheWrapString(ctxt,pxVar3);
          xmlXPathValuePush(ctxt,value);
        }
      }
      xmlXPathReleaseObject(ctxt->context,pxVar5);
      xmlXPathReleaseObject(ctxt->context,pxVar4);
      return;
    }
    iVar1 = 0x17;
  }
  else {
    iVar1 = 0xc;
  }
  xmlXPathErr(ctxt,iVar1);
  return;
}

Assistant:

void
xmlXPathSubstringAfterFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str = NULL;
    xmlXPathObjectPtr find = NULL;
    const xmlChar *point;
    xmlChar *result;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    find = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    str = xmlXPathValuePop(ctxt);
    if (ctxt->error != 0)
        goto error;

    point = xmlStrstr(str->stringval, find->stringval);
    if (point == NULL) {
        result = xmlStrdup(BAD_CAST "");
    } else {
        result = xmlStrdup(point + xmlStrlen(find->stringval));
    }
    if (result == NULL) {
        xmlXPathPErrMemory(ctxt);
        goto error;
    }
    xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, result));

error:
    xmlXPathReleaseObject(ctxt->context, str);
    xmlXPathReleaseObject(ctxt->context, find);
}